

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

void __thiscall Js::AsmJSByteCodeGenerator::LoadAllConstants(AsmJSByteCodeGenerator *this)

{
  FunctionBody *this_00;
  WriteBarrierPtr<void> *pWVar1;
  ulong uVar2;
  undefined1 local_50 [8];
  TypedConstSourcesInfo constSourcesInfo;
  
  this_00 = this->mFunction->mFuncBody;
  FunctionBody::CreateConstantTable(this_00);
  pWVar1 = (this_00->m_constTable).ptr;
  FunctionBody::GetCountField(this_00,ConstantCount);
  constSourcesInfo._16_8_ = pWVar1;
  WAsmJs::TypedRegisterAllocator::GetConstSourceInfos
            ((TypedConstSourcesInfo *)local_50,&this->mFunction->mTypedRegisterAllocator);
  uVar2 = 0;
  do {
    if (*(int *)(local_50 + uVar2 * 4) != -1) {
      (*(code *)((long)&DAT_010ea7b0 + (long)(int)(&DAT_010ea7b0)[uVar2 & 0xffffffff]))();
      return;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 5);
  return;
}

Assistant:

void AsmJSByteCodeGenerator::LoadAllConstants()
    {
        FunctionBody *funcBody = mFunction->GetFuncBody();
        funcBody->CreateConstantTable();
        auto table = funcBody->GetConstTable();
        byte* tableEnd = (byte*)(table + funcBody->GetConstantCount());

        WAsmJs::TypedConstSourcesInfo constSourcesInfo = mFunction->GetTypedRegisterAllocator().GetConstSourceInfos();
        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            uint32 srcByteOffset = constSourcesInfo.srcByteOffsets[i];
            byte* byteTable = ((byte*)table) + srcByteOffset;
            if (srcByteOffset != Js::Constants::InvalidOffset)
            {
                switch (type)
                {
                case WAsmJs::INT32: byteTable = SetConstsToTable<int>(byteTable, 0); break;
                case WAsmJs::FLOAT32: byteTable = SetConstsToTable<float>(byteTable, 0); break;
                case WAsmJs::FLOAT64: byteTable = SetConstsToTable<double>(byteTable, 0); break;
#if TARGET_64
                case WAsmJs::INT64: SetConstsToTable<int64>(byteTable, 0); break;
#endif
                case WAsmJs::SIMD:
                {
                    AsmJsSIMDValue zeroValue;
                    zeroValue.f64[0] = 0; zeroValue.f64[1] = 0;
                    byteTable = SetConstsToTable<AsmJsSIMDValue>(byteTable, zeroValue);
                    break;
                }
                default:
                    Assert(false);
                    break;
                }
                if (byteTable > tableEnd)
                {
                    Assert(UNREACHED);
                    Js::Throw::FatalInternalError();
                }
            }
        }
    }